

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O1

jas_image_t * makediffimage(jas_matrix_t *origdata,jas_matrix_t *recondata)

{
  long lVar1;
  long lVar2;
  jas_seqent_t *pjVar3;
  jas_seqent_t *pjVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  jas_image_t *pjVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  jas_matrix_t *diffdata [3];
  jas_image_cmptparm_t compparms [3];
  undefined1 local_110 [8];
  undefined1 local_108 [8];
  undefined1 local_100 [8];
  undefined1 local_f8 [8];
  undefined1 local_f0 [8];
  undefined1 local_e8 [12];
  undefined8 uStack_dc;
  
  lVar1 = origdata->numrows_;
  lVar2 = origdata->numcols_;
  lVar10 = 0x34;
  do {
    *(undefined8 *)(local_110 + lVar10 + 4) = 0;
    *(undefined8 *)(local_108 + lVar10 + 4) = 0;
    *(undefined8 *)(local_100 + lVar10 + 4) = 1;
    *(undefined8 *)(local_f8 + lVar10 + 4) = 1;
    *(long *)(local_f0 + lVar10 + 4) = lVar2;
    *(long *)(local_e8 + lVar10 + 4) = lVar1;
    *(undefined8 *)((long)&uStack_dc + lVar10) = 8;
    lVar10 = lVar10 + 0x38;
  } while (lVar10 != 0xdc);
  local_108 = (undefined1  [8])origdata;
  local_100 = (undefined1  [8])recondata;
  pjVar11 = (jas_image_t *)jas_image_create(3,(long)&uStack_dc + 4,0x401);
  if (pjVar11 == (jas_image_t *)0x0) {
    makediffimage_cold_3();
LAB_00102c9b:
    if (pjVar11 != (jas_image_t *)0x0) {
      jas_image_destroy(pjVar11);
    }
    pjVar11 = (jas_image_t *)0x0;
  }
  else {
    lVar10 = 0;
    do {
      lVar12 = jas_matrix_create(lVar1);
      *(long *)(local_f8 + lVar10 * 8) = lVar12;
      if (lVar12 == 0) {
        makediffimage_cold_2();
        goto LAB_00102c9b;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    if (0 < lVar1) {
      local_110 = local_f8;
      lVar10 = 0;
      lVar12 = 0;
      do {
        if (0 < lVar2) {
          pjVar3 = (*(jas_seqent_t ***)((long)local_108 + 0x38))[lVar12];
          pjVar4 = (*(jas_seqent_t ***)((long)local_100 + 0x38))[lVar12];
          lVar5 = *(long *)(*(long *)((long)local_f8 + 0x38) + lVar12 * 8);
          lVar6 = *(long *)(*(long *)((long)local_f0 + 0x38) + lVar12 * 8);
          lVar7 = *(long *)(*(long *)(local_e8._0_8_ + 0x38) + lVar12 * 8);
          lVar17 = 0;
          do {
            lVar8 = pjVar3[lVar17];
            lVar13 = lVar8;
            lVar15 = lVar8;
            if (lVar8 < pjVar4[lVar17]) {
              lVar13 = 0xff;
              lVar15 = lVar10;
            }
            lVar14 = lVar15;
            if (pjVar4[lVar17] < lVar8) {
              lVar15 = 0xff;
              lVar14 = lVar10;
              lVar13 = lVar10;
            }
            *(long *)(lVar5 + lVar17 * 8) = lVar15;
            *(long *)(lVar6 + lVar17 * 8) = lVar13;
            *(long *)(lVar7 + lVar17 * 8) = lVar14;
            lVar17 = lVar17 + 1;
          } while (lVar2 != lVar17);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar1);
    }
    uVar16 = 0;
    do {
      iVar9 = jas_image_writecmpt(pjVar11,uVar16 & 0xffffffff,0,0,lVar2,lVar1,
                                  *(undefined8 *)(local_f8 + uVar16 * 8));
      if (iVar9 != 0) {
        makediffimage_cold_1();
        goto LAB_00102c9b;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != 3);
  }
  return pjVar11;
}

Assistant:

jas_image_t *makediffimage(jas_matrix_t *origdata, jas_matrix_t *recondata)
{
	jas_image_t *diffimage;
	jas_matrix_t *diffdata[3];
	int i;
	jas_image_cmptparm_t compparms[3];
	jas_seqent_t a;
	jas_seqent_t b;

	diffimage = 0;
	const jas_matind_t width = jas_matrix_numcols(origdata);
	const jas_matind_t height = jas_matrix_numrows(origdata);

	for (i = 0; i < 3; ++i) {
		compparms[i].tlx = 0;
		compparms[i].tly = 0;
		compparms[i].hstep = 1;
		compparms[i].vstep = 1;
		compparms[i].width = width;
		compparms[i].height = height;
		compparms[i].prec = 8;
		compparms[i].sgnd = false;
	}
	if (!(diffimage = jas_image_create(3, compparms, JAS_CLRSPC_SRGB))) {
		fprintf(stderr, "cannot create image\n");
		goto error;
	}

	for (i = 0; i < 3; ++i) {
		if (!(diffdata[i] = jas_matrix_create(height, width))) {
			fprintf(stderr, "cannot create matrix\n");
			goto error;
		}
	}

	for (jas_matind_t j = 0; j < height; ++j) {
		for (jas_matind_t k = 0; k < width; ++k) {
			a = jas_matrix_get(origdata, j, k);
			b = jas_matrix_get(recondata, j, k);
			if (a > b) {
				jas_matrix_set(diffdata[0], j, k, 255);
				jas_matrix_set(diffdata[1], j, k, 0);
				jas_matrix_set(diffdata[2], j, k, 0);
			} else if (a < b) {
				jas_matrix_set(diffdata[0], j, k, 0);
				jas_matrix_set(diffdata[1], j, k, 255);
				jas_matrix_set(diffdata[2], j, k, 0);
			} else {
				jas_matrix_set(diffdata[0], j, k, a);
				jas_matrix_set(diffdata[1], j, k, a);
				jas_matrix_set(diffdata[2], j, k, a);
			}
		}
	}

	for (i = 0; i < 3; ++i) {
		if (jas_image_writecmpt(diffimage, i, 0, 0, width, height, diffdata[i])) {
			fprintf(stderr, "cannot write image component\n");
			goto error;
		}
	}

	return diffimage;

error:
	if (diffimage) {
		jas_image_destroy(diffimage);
	}
	return 0;
}